

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_value_constructor_forward_list_Test::
~ObjectTest_basic_value_constructor_forward_list_Test
          (ObjectTest_basic_value_constructor_forward_list_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_forward_list) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<object>);
}